

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_backend.c
# Opt level: O0

ECX_KEY * ossl_ecx_key_dup(ECX_KEY *key,int selection)

{
  ECX_KEY *key_00;
  CRYPTO_RWLOCK *pCVar1;
  char *pcVar2;
  uchar *puVar3;
  uint in_ESI;
  char *in_RDI;
  ECX_KEY *ret;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  key_00 = (ECX_KEY *)
           CRYPTO_zalloc((size_t)in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (key_00 == (ECX_KEY *)0x0) {
    ERR_new();
    ERR_set_debug(in_RDI,in_ESI,(char *)key_00);
    ERR_set_error(0x10,0xc0100,(char *)0x0);
    return (ECX_KEY *)0x0;
  }
  pCVar1 = CRYPTO_THREAD_lock_new();
  key_00->lock = pCVar1;
  if (key_00->lock == (CRYPTO_RWLOCK *)0x0) {
    CRYPTO_free(key_00);
    return (ECX_KEY *)0x0;
  }
  key_00->libctx = *(OSSL_LIB_CTX **)in_RDI;
  key_00->field_0x10 = key_00->field_0x10 & 0xfe | in_RDI[0x10] & 1U;
  key_00->keylen = *(size_t *)(in_RDI + 0x58);
  key_00->type = *(ECX_KEY_TYPE *)(in_RDI + 0x60);
  LOCK();
  key_00->references = 1;
  UNLOCK();
  if (*(long *)(in_RDI + 8) != 0) {
    pcVar2 = CRYPTO_strdup(*(char **)(in_RDI + 8),"crypto/ec/ecx_backend.c",0x83);
    key_00->propq = pcVar2;
    if (key_00->propq == (char *)0x0) goto LAB_0040578e;
  }
  if ((in_ESI & 2) != 0) {
    memcpy(key_00->pubkey,in_RDI + 0x11,0x39);
  }
  if ((in_ESI & 1) == 0) {
    return key_00;
  }
  if (*(long *)(in_RDI + 0x50) == 0) {
    return key_00;
  }
  puVar3 = ossl_ecx_key_allocate_privkey((ECX_KEY *)0x40575a);
  if (puVar3 != (uchar *)0x0) {
    memcpy(key_00->privkey,*(void **)(in_RDI + 0x50),key_00->keylen);
    return key_00;
  }
LAB_0040578e:
  ossl_ecx_key_free(key_00);
  ERR_new();
  ERR_set_debug(in_RDI,in_ESI,(char *)key_00);
  ERR_set_error(0x10,0xc0100,(char *)0x0);
  return (ECX_KEY *)0x0;
}

Assistant:

ECX_KEY *ossl_ecx_key_dup(const ECX_KEY *key, int selection)
{
    ECX_KEY *ret = OPENSSL_zalloc(sizeof(*ret));

    if (ret == NULL) {
        ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    ret->lock = CRYPTO_THREAD_lock_new();
    if (ret->lock == NULL) {
        OPENSSL_free(ret);
        return NULL;
    }

    ret->libctx = key->libctx;
    ret->haspubkey = key->haspubkey;
    ret->keylen = key->keylen;
    ret->type = key->type;
    ret->references = 1;

    if (key->propq != NULL) {
        ret->propq = OPENSSL_strdup(key->propq);
        if (ret->propq == NULL)
            goto err;
    }

    if ((selection & OSSL_KEYMGMT_SELECT_PUBLIC_KEY) != 0)
        memcpy(ret->pubkey, key->pubkey, sizeof(ret->pubkey));

    if ((selection & OSSL_KEYMGMT_SELECT_PRIVATE_KEY) != 0
        && key->privkey != NULL) {
        if (ossl_ecx_key_allocate_privkey(ret) == NULL)
            goto err;
        memcpy(ret->privkey, key->privkey, ret->keylen);
    }

    return ret;

err:
    ossl_ecx_key_free(ret);
    ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
    return NULL;
}